

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

optional_idx __thiscall
duckdb::FunctionBinder::MultipleCandidateException<duckdb::ScalarFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::ScalarFunction> *functions,
          vector<unsigned_long,_true> *candidate_functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  ErrorData *pEVar1;
  undefined1 auVar2 [8];
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  idx_t *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  string candidate_str;
  string call_str;
  ScalarFunction f;
  string local_270;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  ErrorData *local_230;
  idx_t *local_228;
  FunctionSet<duckdb::ScalarFunction> *local_220;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  string local_198;
  string local_178;
  undefined1 local_158 [8];
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  char local_120 [16];
  vector<duckdb::LogicalType,_true> local_110 [2];
  LogicalType local_e0;
  LogicalType local_c8;
  _Any_data local_a8;
  _Manager_type local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arguments;
  local_230 = error;
  local_220 = functions;
  LogicalType::LogicalType((LogicalType *)local_158,INVALID);
  Function::CallToString(&local_178,name,arguments,(LogicalType *)local_158);
  LogicalType::~LogicalType((LogicalType *)local_158);
  local_218 = local_208;
  local_210 = 0;
  local_208[0] = 0;
  piVar6 = (candidate_functions->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_228 = (candidate_functions->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (piVar6 != local_228) {
    do {
      FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
                ((ScalarFunction *)local_158,local_220,*piVar6);
      Function::CallToString(&local_198,(string *)local_150,local_110,&local_e0,&local_c8);
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x14a8af7);
      local_250 = &local_240;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_240 = *plVar4;
        lStack_238 = plVar3[3];
      }
      else {
        local_240 = *plVar4;
        local_250 = (long *)*plVar3;
      }
      local_248 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_250);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_270.field_2._M_allocated_capacity = *psVar5;
        local_270.field_2._8_8_ = plVar3[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar5;
        local_270._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_270._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_270._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_158 = (undefined1  [8])&PTR__ScalarFunction_01993078;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      if (local_98 != (_Manager_type)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      local_158 = (undefined1  [8])&PTR__BaseScalarFunction_019937c0;
      LogicalType::~LogicalType(&local_c8);
      SimpleFunction::~SimpleFunction((SimpleFunction *)local_158);
      piVar6 = piVar6 + 1;
    } while (piVar6 != local_228);
  }
  local_1b8[0] = local_1a8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,
             "Could not choose a best candidate function for the function call \"%s\". In order to select one, please add explicit type casts.\n\tCandidate functions:\n%s"
             ,"");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_1f8,local_218,local_218 + local_210);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_270,(StringUtil *)local_1b8,&local_1d8,&local_1f8,params_1);
  ErrorData::ErrorData((ErrorData *)local_158,BINDER,&local_270);
  auVar2 = local_158;
  pEVar1 = local_230;
  local_230->initialized = (bool)local_158[0];
  local_230->type = local_158[1];
  local_158 = auVar2;
  ::std::__cxx11::string::operator=((string *)&local_230->raw_message,(string *)local_150);
  ::std::__cxx11::string::operator=((string *)&pEVar1->final_message,(string *)&local_130);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&pEVar1->extra_info,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_110);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_110);
  if (local_130._M_p != local_120) {
    operator_delete(local_130._M_p);
  }
  if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx FunctionBinder::MultipleCandidateException(const string &name, FunctionSet<T> &functions,
                                                        vector<idx_t> &candidate_functions,
                                                        const vector<LogicalType> &arguments, ErrorData &error) {
	D_ASSERT(functions.functions.size() > 1);
	// there are multiple possible function definitions
	// throw an exception explaining which overloads are there
	string call_str = Function::CallToString(name, arguments);
	string candidate_str;
	for (auto &conf : candidate_functions) {
		T f = functions.GetFunctionByOffset(conf);
		candidate_str += "\t" + f.ToString() + "\n";
	}
	error = ErrorData(
	    ExceptionType::BINDER,
	    StringUtil::Format("Could not choose a best candidate function for the function call \"%s\". In order to "
	                       "select one, please add explicit type casts.\n\tCandidate functions:\n%s",
	                       call_str, candidate_str));
	return optional_idx();
}